

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print_test.cpp
# Opt level: O2

void __thiscall StringPrintf_Basics_Test::TestBody(StringPrintf_Basics_Test *this)

{
  bool bVar1;
  DeathTest *pDVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  DeathTest **test;
  double *in_R9;
  DeathTest *gtest_dt;
  ReturnSentinel gtest_sentinel;
  scoped_ptr<testing::internal::DeathTest> gtest_dt_ptr;
  AssertionResult gtest_ar;
  RE local_148;
  int local_b4;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  pbrt::StringPrintf<>((string *)&local_148,"Hello, world");
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[13]>
            ((internal *)&gtest_ar,"StringPrintf(\"Hello, world\")","\"Hello, world\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_148,
             (char (*) [13])"Hello, world");
  std::__cxx11::string::~string((string *)&local_148);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_148);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/print_test.cpp"
               ,0x17,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)&local_148);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_148);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_dt = (DeathTest *)CONCAT44(gtest_dt._4_4_,5);
  pbrt::StringPrintf<int>((string *)&local_148,"x = %d",(int *)&gtest_dt);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[6]>
            ((internal *)&gtest_ar,"StringPrintf(\"x = %d\", 5)","\"x = 5\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_148,
             (char (*) [6])"x = 5");
  std::__cxx11::string::~string((string *)&local_148);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_148);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/print_test.cpp"
               ,0x18,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)&local_148);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_148);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_sentinel.test_ = (DeathTest *)0xc020400000000000;
  gtest_dt_ptr.ptr_ = (DeathTest *)0x3ff8000000000000;
  gtest_dt = (DeathTest *)&DAT_3ff0000000000000;
  pbrt::StringPrintf<double,double,double>
            ((string *)&local_148,(pbrt *)"%f, %f, %f",(char *)&gtest_dt,(double *)&gtest_dt_ptr,
             (double *)&gtest_sentinel,in_R9);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[15]>
            ((internal *)&gtest_ar,"StringPrintf(\"%f, %f, %f\", 1., 1.5, -8.125)",
             "\"1, 1.5, -8.125\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_148,
             (char (*) [15])"1, 1.5, -8.125");
  std::__cxx11::string::~string((string *)&local_148);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_148);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/print_test.cpp"
               ,0x19,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)&local_148);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_148);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    testing::internal::RE::Init(&local_148,"Not enough optional values");
    bVar3 = testing::internal::DeathTest::Create
                      ("StringPrintf(\"not enough %s\")",&local_148,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/print_test.cpp"
                       ,0x1b,&gtest_dt);
    if (bVar3) {
      if (gtest_dt != (DeathTest *)0x0) {
        gtest_dt_ptr.ptr_ = gtest_dt;
        iVar4 = (*gtest_dt->_vptr_DeathTest[2])();
        pDVar2 = gtest_dt;
        if (iVar4 == 0) {
          iVar4 = (*gtest_dt->_vptr_DeathTest[3])(gtest_dt);
          bVar3 = testing::internal::ExitedUnsuccessfully(iVar4);
          iVar4 = (*pDVar2->_vptr_DeathTest[4])(pDVar2,(ulong)bVar3);
          if ((char)iVar4 != '\0') goto LAB_0033a397;
          bVar3 = true;
          bVar1 = false;
        }
        else {
          if (iVar4 == 1) {
            gtest_sentinel.test_ = gtest_dt;
            bVar3 = testing::internal::AlwaysTrue();
            if (bVar3) {
              pbrt::StringPrintf<>(&local_50,"not enough %s");
              std::__cxx11::string::~string((string *)&local_50);
            }
            (*gtest_dt->_vptr_DeathTest[5])(gtest_dt,2);
            testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&gtest_sentinel);
          }
LAB_0033a397:
          bVar1 = true;
          bVar3 = false;
        }
        testing::internal::scoped_ptr<testing::internal::DeathTest>::~scoped_ptr(&gtest_dt_ptr);
        if (!bVar1) goto LAB_0033a3ad;
      }
      bVar3 = false;
    }
    else {
      bVar3 = true;
    }
LAB_0033a3ad:
    testing::internal::RE::~RE(&local_148);
    if (bVar3) goto LAB_0033a3bb;
  }
  else {
LAB_0033a3bb:
    testing::Message::Message((Message *)&local_148);
    pcVar5 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/print_test.cpp"
               ,0x1b,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_148);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_148);
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    testing::internal::RE::Init(&local_148,"Not enough optional values");
    bVar3 = testing::internal::DeathTest::Create
                      ("StringPrintf(\"not enough %f yolo\")",&local_148,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/print_test.cpp"
                       ,0x1c,&gtest_dt);
    if (bVar3) {
      if (gtest_dt != (DeathTest *)0x0) {
        gtest_dt_ptr.ptr_ = gtest_dt;
        iVar4 = (*gtest_dt->_vptr_DeathTest[2])();
        pDVar2 = gtest_dt;
        if (iVar4 == 0) {
          iVar4 = (*gtest_dt->_vptr_DeathTest[3])(gtest_dt);
          bVar3 = testing::internal::ExitedUnsuccessfully(iVar4);
          iVar4 = (*pDVar2->_vptr_DeathTest[4])(pDVar2,(ulong)bVar3);
          if ((char)iVar4 != '\0') goto LAB_0033a4e8;
          bVar3 = true;
          bVar1 = false;
        }
        else {
          if (iVar4 == 1) {
            gtest_sentinel.test_ = gtest_dt;
            bVar3 = testing::internal::AlwaysTrue();
            if (bVar3) {
              pbrt::StringPrintf<>(&local_70,"not enough %f yolo");
              std::__cxx11::string::~string((string *)&local_70);
            }
            (*gtest_dt->_vptr_DeathTest[5])(gtest_dt,2);
            testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&gtest_sentinel);
          }
LAB_0033a4e8:
          bVar1 = true;
          bVar3 = false;
        }
        testing::internal::scoped_ptr<testing::internal::DeathTest>::~scoped_ptr(&gtest_dt_ptr);
        if (!bVar1) goto LAB_0033a4fe;
      }
      bVar3 = false;
    }
    else {
      bVar3 = true;
    }
LAB_0033a4fe:
    testing::internal::RE::~RE(&local_148);
    if (bVar3) goto LAB_0033a50c;
  }
  else {
LAB_0033a50c:
    testing::Message::Message((Message *)&local_148);
    pcVar5 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/print_test.cpp"
               ,0x1c,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_148);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_148);
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    testing::internal::RE::Init(&local_148,"Excess values passed");
    test = &gtest_dt;
    bVar3 = testing::internal::DeathTest::Create
                      ("StringPrintf(\"too many %f yolo\", 1, 2)",&local_148,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/print_test.cpp"
                       ,0x1d,test);
    if (bVar3) {
      if (gtest_dt != (DeathTest *)0x0) {
        gtest_dt_ptr.ptr_ = gtest_dt;
        iVar4 = (*gtest_dt->_vptr_DeathTest[2])();
        pDVar2 = gtest_dt;
        if (iVar4 == 0) {
          iVar4 = (*gtest_dt->_vptr_DeathTest[3])(gtest_dt);
          bVar3 = testing::internal::ExitedUnsuccessfully(iVar4);
          iVar4 = (*pDVar2->_vptr_DeathTest[4])(pDVar2,(ulong)bVar3);
          if ((char)iVar4 != '\0') goto LAB_0033a65a;
          iVar4 = 6;
          bVar3 = false;
        }
        else {
          if (iVar4 == 1) {
            gtest_sentinel.test_ = gtest_dt;
            bVar3 = testing::internal::AlwaysTrue();
            if (bVar3) {
              gtest_ar.success_ = true;
              gtest_ar._1_3_ = 0;
              local_b4 = 2;
              pbrt::StringPrintf<int,int>
                        (&local_90,(pbrt *)"too many %f yolo",&gtest_ar.success_,&local_b4,
                         (int *)test);
              std::__cxx11::string::~string((string *)&local_90);
            }
            (*gtest_dt->_vptr_DeathTest[5])(gtest_dt,2);
            testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&gtest_sentinel);
          }
LAB_0033a65a:
          bVar3 = true;
          iVar4 = 0;
        }
        testing::internal::scoped_ptr<testing::internal::DeathTest>::~scoped_ptr(&gtest_dt_ptr);
        if (!bVar3) goto LAB_0033a670;
      }
      iVar4 = 0;
    }
    else {
      iVar4 = 6;
    }
LAB_0033a670:
    testing::internal::RE::~RE(&local_148);
    if (iVar4 != 0) goto LAB_0033a67e;
  }
  else {
LAB_0033a67e:
    testing::Message::Message((Message *)&local_148);
    pcVar5 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/print_test.cpp"
               ,0x1d,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_148);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_148);
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (!bVar3) goto LAB_0033a7de;
  testing::internal::RE::Init(&local_148,"Excess values passed");
  bVar3 = testing::internal::DeathTest::Create
                    ("StringPrintf(\"too many\", 1)",&local_148,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/print_test.cpp"
                     ,0x1e,&gtest_dt);
  if (bVar3) {
    if (gtest_dt != (DeathTest *)0x0) {
      gtest_dt_ptr.ptr_ = gtest_dt;
      iVar4 = (*gtest_dt->_vptr_DeathTest[2])();
      pDVar2 = gtest_dt;
      if (iVar4 == 0) {
        iVar4 = (*gtest_dt->_vptr_DeathTest[3])(gtest_dt);
        bVar3 = testing::internal::ExitedUnsuccessfully(iVar4);
        iVar4 = (*pDVar2->_vptr_DeathTest[4])(pDVar2,(ulong)bVar3);
        if ((char)iVar4 != '\0') goto LAB_0033a7ba;
        bVar3 = true;
        bVar1 = false;
      }
      else {
        if (iVar4 == 1) {
          gtest_sentinel.test_ = gtest_dt;
          bVar3 = testing::internal::AlwaysTrue();
          if (bVar3) {
            gtest_ar.success_ = true;
            gtest_ar._1_3_ = 0;
            pbrt::StringPrintf<int>(&local_b0,"too many",(int *)&gtest_ar);
            std::__cxx11::string::~string((string *)&local_b0);
          }
          (*gtest_dt->_vptr_DeathTest[5])(gtest_dt,2);
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&gtest_sentinel);
        }
LAB_0033a7ba:
        bVar1 = true;
        bVar3 = false;
      }
      testing::internal::scoped_ptr<testing::internal::DeathTest>::~scoped_ptr(&gtest_dt_ptr);
      if (!bVar1) goto LAB_0033a7d0;
    }
    bVar3 = false;
  }
  else {
    bVar3 = true;
  }
LAB_0033a7d0:
  testing::internal::RE::~RE(&local_148);
  if (!bVar3) {
    return;
  }
LAB_0033a7de:
  testing::Message::Message((Message *)&local_148);
  pcVar5 = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/print_test.cpp"
             ,0x1e,pcVar5);
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_148);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_148);
  return;
}

Assistant:

TEST(StringPrintf, Basics) {
    EXPECT_EQ(StringPrintf("Hello, world"), "Hello, world");
    EXPECT_EQ(StringPrintf("x = %d", 5), "x = 5");
    EXPECT_EQ(StringPrintf("%f, %f, %f", 1., 1.5, -8.125), "1, 1.5, -8.125");
#ifndef PBRT_IS_WINDOWS
    EXPECT_DEATH(StringPrintf("not enough %s"), "Not enough optional values");
    EXPECT_DEATH(StringPrintf("not enough %f yolo"), "Not enough optional values");
    EXPECT_DEATH(StringPrintf("too many %f yolo", 1, 2), "Excess values passed");
    EXPECT_DEATH(StringPrintf("too many", 1), "Excess values passed");
#endif
}